

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwTestMem(void *p,uint len,int c)

{
  byte *local_28;
  uchar *ptr;
  int c_local;
  uint len_local;
  void *p_local;
  
  local_28 = (byte *)p;
  ptr._4_4_ = len;
  while( true ) {
    if (ptr._4_4_ == 0) {
      return (void *)0x0;
    }
    if ((uint)*local_28 != (c & 0xffU)) break;
    local_28 = local_28 + 1;
    ptr._4_4_ = ptr._4_4_ - 1;
  }
  return local_28;
}

Assistant:

static const void *mwTestMem(const void *p, unsigned len, int c)
{
	const unsigned char *ptr;
	ptr = (const unsigned char *) p;
	while (len--) {
		if (*ptr != (unsigned char)c) {
			return (const void *)ptr;
		}
		ptr ++;
	}
	return NULL;
}